

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O2

DWORD __thiscall FNodeBuilder::SplitSeg(FNodeBuilder *this,DWORD segnum,int splitvert,int v1InFront)

{
  DWORD DVar1;
  FPrivVert *pFVar2;
  int iVar3;
  FPrivSeg *pFVar4;
  DWORD *pDVar5;
  long lVar6;
  FPrivSeg *pFVar7;
  FPrivSeg *pFVar8;
  FPrivSeg newseg;
  
  DVar1 = (this->Segs).Count;
  pFVar4 = (this->Segs).Array + segnum;
  pFVar7 = pFVar4;
  pFVar8 = &newseg;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    iVar3 = pFVar7->v2;
    pFVar8->v1 = pFVar7->v1;
    pFVar8->v2 = iVar3;
    pFVar7 = (FPrivSeg *)&pFVar7->sidedef;
    pFVar8 = (FPrivSeg *)&pFVar8->sidedef;
  }
  if (v1InFront < 1) {
    pFVar4->v1 = splitvert;
    lVar6 = (long)newseg.v1;
    newseg.v2 = splitvert;
    RemoveSegFromVert1(this,segnum,newseg.v1);
    pFVar2 = (this->Vertices).Array;
    newseg.nextforvert = pFVar2[lVar6].segs;
    pFVar2[lVar6].segs = DVar1;
    pDVar5 = &pFVar2[splitvert].segs;
    newseg.nextforvert2 = pFVar2[splitvert].segs2;
    pFVar2[splitvert].segs2 = DVar1;
    (this->Segs).Array[segnum].nextforvert = *pDVar5;
  }
  else {
    pFVar4->v2 = splitvert;
    lVar6 = (long)newseg.v2;
    newseg.v1 = splitvert;
    RemoveSegFromVert2(this,segnum,newseg.v2);
    pFVar2 = (this->Vertices).Array;
    pDVar5 = &pFVar2[splitvert].segs2;
    newseg.nextforvert = pFVar2[splitvert].segs;
    pFVar2[splitvert].segs = DVar1;
    newseg.nextforvert2 = pFVar2[lVar6].segs2;
    pFVar2[lVar6].segs2 = DVar1;
    (this->Segs).Array[segnum].nextforvert2 = *pDVar5;
  }
  *pDVar5 = segnum;
  TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Push(&this->Segs,&newseg);
  return DVar1;
}

Assistant:

DWORD FNodeBuilder::SplitSeg (DWORD segnum, int splitvert, int v1InFront)
{
	double dx, dy;
	FPrivSeg newseg;
	int newnum = (int)Segs.Size();

	newseg = Segs[segnum];
	dx = double(Vertices[splitvert].x - Vertices[newseg.v1].x);
	dy = double(Vertices[splitvert].y - Vertices[newseg.v1].y);
	if (v1InFront > 0)
	{
		newseg.v1 = splitvert;
		Segs[segnum].v2 = splitvert;

		RemoveSegFromVert2 (segnum, newseg.v2);

		newseg.nextforvert = Vertices[splitvert].segs;
		Vertices[splitvert].segs = newnum;

		newseg.nextforvert2 = Vertices[newseg.v2].segs2;
		Vertices[newseg.v2].segs2 = newnum;

		Segs[segnum].nextforvert2 = Vertices[splitvert].segs2;
		Vertices[splitvert].segs2 = segnum;
	}
	else
	{
		Segs[segnum].v1 = splitvert;
		newseg.v2 = splitvert;

		RemoveSegFromVert1 (segnum, newseg.v1);

		newseg.nextforvert = Vertices[newseg.v1].segs;
		Vertices[newseg.v1].segs = newnum;

		newseg.nextforvert2 = Vertices[splitvert].segs2;
		Vertices[splitvert].segs2 = newnum;

		Segs[segnum].nextforvert = Vertices[splitvert].segs;
		Vertices[splitvert].segs = segnum;
	}

	Segs.Push (newseg);

	D(Printf (PRINT_LOG, "Split seg %d to get seg %d\n", segnum, newnum));

	return newnum;
}